

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

boolean burnarmor(monst *victim)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  obj *local_190;
  obj *local_188;
  obj *local_180;
  obj *local_178;
  obj *local_168;
  obj *local_158;
  char *local_150;
  obj *local_140;
  char local_128 [4];
  int mat_idx;
  char buf [256];
  obj *item;
  monst *victim_local;
  
  if (victim != (monst *)0x0) {
    do {
      iVar2 = rn2(5);
      switch(iVar2) {
      case 0:
        if (victim == &youmonst) {
          local_140 = uarmh;
        }
        else {
          local_140 = which_armor(victim,4);
        }
        if (local_140 == (obj *)0x0) {
          local_150 = "helmet";
        }
        else {
          sprintf(local_128,"%s helmet",
                  materialnm
                  [(int)(uint)(*(ushort *)&objects[local_140->otyp].field_0x11 >> 4 & 0x1f)]);
          local_150 = local_128;
        }
        cVar1 = rust_dmg(local_140,local_150,0,'\0',victim);
        break;
      case 1:
        if (victim == &youmonst) {
          local_158 = uarmc;
        }
        else {
          local_158 = which_armor(victim,2);
        }
        if (local_158 != (obj *)0x0) {
          pcVar3 = cloak_simple_name(local_158);
          rust_dmg(local_158,pcVar3,0,'\0',victim);
          return '\x01';
        }
        if (victim == &youmonst) {
          local_168 = uarm;
        }
        else {
          local_168 = which_armor(victim,1);
        }
        if (local_168 == (obj *)0x0) {
          if (victim == &youmonst) {
            local_178 = uarmu;
          }
          else {
            local_178 = which_armor(victim,0x40);
          }
          if (local_178 != (obj *)0x0) {
            rust_dmg(local_178,"shirt",0,'\0',victim);
          }
          return '\x01';
        }
        pcVar3 = xname(local_168);
        rust_dmg(local_168,pcVar3,0,'\0',victim);
        return '\x01';
      case 2:
        if (victim == &youmonst) {
          local_180 = uarms;
        }
        else {
          local_180 = which_armor(victim,8);
        }
        cVar1 = rust_dmg(local_180,"wooden shield",0,'\0',victim);
        break;
      case 3:
        if (victim == &youmonst) {
          local_188 = uarmg;
        }
        else {
          local_188 = which_armor(victim,0x10);
        }
        cVar1 = rust_dmg(local_188,"gloves",0,'\0',victim);
        break;
      case 4:
        if (victim == &youmonst) {
          local_190 = uarmf;
        }
        else {
          local_190 = which_armor(victim,0x20);
        }
        cVar1 = rust_dmg(local_190,"boots",0,'\0',victim);
        break;
      default:
        goto switchD_00303c92_default;
      }
    } while (cVar1 == '\0');
switchD_00303c92_default:
  }
  return '\0';
}

Assistant:

boolean burnarmor(struct monst *victim)
{
    struct obj *item;
    char buf[BUFSZ];
    int mat_idx;
    
    if (!victim) return 0;
#define burn_dmg(obj,descr) rust_dmg(obj, descr, 0, FALSE, victim)
    while (1) {
	switch (rn2(5)) {
	case 0:
	    item = (victim == &youmonst) ? uarmh : which_armor(victim, W_ARMH);
	    if (item) {
		mat_idx = objects[item->otyp].oc_material;
	    	sprintf(buf,"%s helmet", materialnm[mat_idx] );
	    }
	    if (!burn_dmg(item, item ? buf : "helmet")) continue;
	    break;
	case 1:
	    item = (victim == &youmonst) ? uarmc : which_armor(victim, W_ARMC);
	    if (item) {
		burn_dmg(item, cloak_simple_name(item));
		return TRUE;
	    }
	    item = (victim == &youmonst) ? uarm : which_armor(victim, W_ARM);
	    if (item) {
		burn_dmg(item, xname(item));
		return TRUE;
	    }
	    item = (victim == &youmonst) ? uarmu : which_armor(victim, W_ARMU);
	    if (item)
		burn_dmg(item, "shirt");
	    return TRUE;
	case 2:
	    item = (victim == &youmonst) ? uarms : which_armor(victim, W_ARMS);
	    if (!burn_dmg(item, "wooden shield")) continue;
	    break;
	case 3:
	    item = (victim == &youmonst) ? uarmg : which_armor(victim, W_ARMG);
	    if (!burn_dmg(item, "gloves")) continue;
	    break;
	case 4:
	    item = (victim == &youmonst) ? uarmf : which_armor(victim, W_ARMF);
	    if (!burn_dmg(item, "boots")) continue;
	    break;
	}
	break; /* Out of while loop */
    }
    return FALSE;
#undef burn_dmg
}